

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O3

int lupdate(lua_State *L)

{
  int *piVar1;
  stm_copy *copy;
  int iVar2;
  size_t in_RAX;
  undefined8 *puVar3;
  void *__dest;
  size_t __n;
  char *__src;
  undefined4 *puVar4;
  size_t sz;
  size_t local_28;
  
  local_28 = in_RAX;
  puVar3 = (undefined8 *)lua_touserdata(L,1);
  iVar2 = lua_isuserdata(L,2);
  if (iVar2 == 0) {
    __src = luaL_checklstring(L,2,&local_28);
    __n = local_28;
    __dest = malloc(local_28);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = lua_touserdata(L,2);
    __n = luaL_checkinteger(L,3);
    local_28 = __n;
  }
  piVar1 = (int *)*puVar3;
  puVar4 = (undefined4 *)malloc(0x10);
  *puVar4 = 1;
  puVar4[1] = (int)__n;
  *(void **)(puVar4 + 2) = __dest;
  do {
    LOCK();
    iVar2 = *piVar1;
    *piVar1 = 1;
    UNLOCK();
  } while (iVar2 != 0);
  do {
  } while (piVar1[1] != 0);
  copy = *(stm_copy **)(piVar1 + 4);
  *(undefined4 **)(piVar1 + 4) = puVar4;
  *piVar1 = 0;
  stm_releasecopy(copy);
  return 0;
}

Assistant:

static int
lupdate(lua_State *L) {
	luaL_checktype(L, 1, LUA_TUSERDATA);
	luaL_checktype(L, 2, LUA_TLIGHTUSERDATA);
	luaL_checktype(L, 3, LUA_TTABLE);
	struct ctrl * c= lua_touserdata(L, 1);
	struct table *n = lua_touserdata(L, 2);
	if (c->root == n) {
		return luaL_error(L, "You should update a new object");
	}
	lua_settop(L, 3);
	lua_setuservalue(L, 1);
	c->update = n;

	return 0;
}